

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslsocket.cpp
# Opt level: O0

void __thiscall QSslSocketPrivate::~QSslSocketPrivate(QSslSocketPrivate *this)

{
  QSslConfigurationPrivate *in_RDI;
  
  *(undefined ***)in_RDI = &PTR__QSslSocketPrivate_004a0650;
  in_RDI[1].sessionCipher.d._M_t.
  super___uniq_ptr_impl<QSslCipherPrivate,_std::default_delete<QSslCipherPrivate>_>._M_t.
  super__Tuple_impl<0UL,_QSslCipherPrivate_*,_std::default_delete<QSslCipherPrivate>_>.
  super__Head_base<0UL,_QSslCipherPrivate_*,_false>._M_head_impl =
       (QSslCipherPrivate *)&PTR__QSslSocketPrivate_004a06f0;
  std::unique_ptr<QTlsPrivate::TlsCryptograph,_std::default_delete<QTlsPrivate::TlsCryptograph>_>::
  ~unique_ptr((unique_ptr<QTlsPrivate::TlsCryptograph,_std::default_delete<QTlsPrivate::TlsCryptograph>_>
               *)in_RDI);
  QString::~QString((QString *)0x3a5276);
  QSslConfigurationPrivate::~QSslConfigurationPrivate(in_RDI);
  QList<QSslError>::~QList((QList<QSslError> *)0x3a5298);
  QTcpSocketPrivate::~QTcpSocketPrivate((QTcpSocketPrivate *)0x3a52a2);
  return;
}

Assistant:

QSslSocketPrivate::~QSslSocketPrivate()
{
}